

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_get_opcode_param_type
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op,sexp_conflict k)

{
  sexp_conflict in_RCX;
  sexp_conflict in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  int p;
  sexp_conflict res;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x1b)) {
    if ((in_R8 & 1) == 1) {
      local_8 = sexp_translate_opcode_type(in_RDX,in_RCX);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x1b,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_opcode_param_type (sexp ctx, sexp self, sexp_sint_t n, sexp op, sexp k) {
  sexp res;
  int p = sexp_unbox_fixnum(k);
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  else if (! sexp_fixnump(k))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, k);
  if (p > sexp_opcode_num_args(op) && sexp_opcode_variadic_p(op))
    p = sexp_opcode_num_args(op);
  switch (p) {
  case 0:
    res = sexp_opcode_arg1_type(op);
    break;
  case 1:
    res = sexp_opcode_arg2_type(op);
    break;
  default:
    res = sexp_opcode_arg3_type(op);
    if (res && sexp_vectorp(res)) {
      if (sexp_vector_length(res) > (unsigned)(sexp_unbox_fixnum(k)-2))
        res = sexp_vector_ref(res, sexp_fx_sub(k, SEXP_TWO));
      else
        res = sexp_type_by_index(ctx, SEXP_OBJECT);
    }
    break;
  }
  return sexp_translate_opcode_type(ctx, res);
}